

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O1

pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::pop
          (UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_> *this)

{
  _Map_pointer pppVar1;
  _Elt_pointer ppVar2;
  mapped_type *pmVar3;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> pVar4;
  undefined1 auStack_38 [8];
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> item;
  
  do {
    pppVar1 = (this->data).c.
              super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar2 = (this->data).c.
             super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (((long)(this->data).c.
               super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar2 >> 4) +
        ((long)(this->data).c.
               super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->data).c.
               super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
        ((((ulong)((long)pppVar1 -
                  (long)(this->data).c.
                        super__Deque_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(pppVar1 == (_Map_pointer)0x0)) * 0x20 == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                    ,0x34,
                    "T wasm::UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock *, unsigned int>>::pop() [T = std::pair<wasm::LocalGraphFlower::FlowBlock *, unsigned int>]"
                   );
    }
    auStack_38 = (undefined1  [8])ppVar2->first;
    item.first._0_4_ = (undefined4)*(undefined8 *)&ppVar2->second;
    item.first._4_4_ = (undefined4)((ulong)*(undefined8 *)&ppVar2->second >> 0x20);
    pmVar3 = std::__detail::
             _Map_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->count,(key_type *)auStack_38);
    *pmVar3 = *pmVar3 - 1;
    std::
    deque<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
    ::pop_front((deque<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
                 *)this);
    pmVar3 = std::__detail::
             _Map_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->count,(key_type *)auStack_38);
  } while (*pmVar3 != 0);
  pVar4.second = item.first._0_4_;
  pVar4.first = (FlowBlock *)auStack_38;
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

T pop() {
    while (1) {
      assert(!empty());
      T item = data.front();
      count[item]--;
      data.pop();
      if (count[item] == 0) {
        return item;
      }
      // skip this one, keep going
    }
  }